

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB1555ToARGBRow_C(uint8_t *src_argb1555,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t a;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb1555_local;
  
  dst_argb_local = dst_argb;
  src_argb1555_local = src_argb1555;
  for (x = 0; x < width; x = x + 1) {
    bVar3 = (byte)((int)(uint)*src_argb1555_local >> 5) | (src_argb1555_local[1] & 3) << 3;
    bVar1 = src_argb1555_local[1];
    bVar2 = src_argb1555_local[1];
    *dst_argb_local =
         (*src_argb1555_local & 0x1f) << 3 | (byte)((int)(uint)(*src_argb1555_local & 0x1f) >> 2);
    dst_argb_local[1] = bVar3 << 3 | (byte)((int)(uint)bVar3 >> 2);
    dst_argb_local[2] = (char)((int)(bVar1 & 0x7c) >> 2) << 3 | (byte)((int)(bVar1 & 0x7c) >> 4);
    dst_argb_local[3] = -(char)((int)(uint)bVar2 >> 7);
    dst_argb_local = dst_argb_local + 4;
    src_argb1555_local = src_argb1555_local + 2;
  }
  return;
}

Assistant:

void ARGB1555ToARGBRow_C(const uint8_t* src_argb1555,
                         uint8_t* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb1555[0] & 0x1f;
    uint8_t g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t a = src_argb1555[1] >> 7;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 3) | (g >> 2);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = -a;
    dst_argb += 4;
    src_argb1555 += 2;
  }
}